

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

int32_t __thiscall avro::BinaryDecoder::decodeInt(BinaryDecoder *this)

{
  int64_t iVar1;
  undefined8 uVar2;
  int64_t val;
  long *in_stack_fffffffffffffee8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  format *in_stack_ffffffffffffff28;
  Exception *in_stack_ffffffffffffff30;
  BinaryDecoder *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff58;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  iVar1 = doDecodeLong(in_stack_ffffffffffffff40);
  if ((-0x80000001 < iVar1) && (iVar1 < 0x80000000)) {
    return (int32_t)iVar1;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  Exception::Exception(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int32_t BinaryDecoder::decodeInt()
{
    int64_t val = doDecodeLong();
    if (val < INT32_MIN || val > INT32_MAX) {
        throw Exception(
            boost::format("Value out of range for Avro int: %1%") % val);
    }
    return static_cast<int32_t>(val);
}